

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsScissorMultiViewportTests.cpp
# Opt level: O1

void __thiscall
vkt::FragmentOperations::anon_unknown_0::ScissorRenderer::~ScissorRenderer(ScissorRenderer *this)

{
  long *plVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  VkCommandPool obj;
  VkPipeline obj_00;
  VkPipelineLayout obj_01;
  VkFramebuffer obj_02;
  VkRenderPass obj_03;
  VkShaderModule VVar4;
  VkAllocationCallbacks *pVVar5;
  VkBuffer obj_04;
  VkImageView obj_05;
  VkImage obj_06;
  
  if ((this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal !=
      0) {
    plVar1 = *(long **)this[1].m_renderSize.m_data;
    uVar2._0_4_ = this[1].m_colorFormat;
    uVar2._4_4_ = this[1].m_colorSubresourceRange.aspectMask;
    uVar3._0_4_ = this[1].m_colorSubresourceRange.baseMipLevel;
    uVar3._4_4_ = this[1].m_colorSubresourceRange.levelCount;
    (**(code **)(*plVar1 + 0x240))(plVar1,uVar2,uVar3,1);
  }
  this[1].m_colorFormat = VK_FORMAT_UNDEFINED;
  this[1].m_colorSubresourceRange.aspectMask = 0;
  this[1].m_colorSubresourceRange.baseMipLevel = 0;
  this[1].m_colorSubresourceRange.levelCount = 0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  *(undefined8 *)this[1].m_renderSize.m_data = 0;
  obj.m_internal =
       (deUint64)
       (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&this->m_cmdBuffer,obj);
  }
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  obj_00.m_internal =
       (deUint64)
       (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
       m_allocator;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)&this->m_cmdPool,obj_00);
  }
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  obj_01.m_internal =
       (deUint64)
       (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
       m_allocator;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)&this->m_pipelineLayout,obj_01);
  }
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.object.m_internal =
       0;
  obj_02.m_internal =
       (deUint64)
       (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
       m_allocator;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)&this->m_framebuffer,obj_02);
  }
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal = 0;
  obj_03.m_internal =
       (deUint64)
       (this->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_allocator;
  if (obj_03.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)17>_> *)&this->m_renderPass,obj_03);
  }
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)0x0;
  (this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  VVar4.m_internal =
       (deUint64)
       (this->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
       m_allocator;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&this->m_fragmentModule,VVar4);
  }
  (this->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal =
       0;
  VVar4.m_internal =
       *(deUint64 *)
        &(this->m_vertexBufferAlloc).
         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)&this->m_vertexModule,VVar4);
  }
  (this->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  *(undefined8 *)
   &(this->m_vertexBufferAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8 = 0;
  (this->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.m_internal = 0
  ;
  VVar4.m_internal =
       (deUint64)
       (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
       m_deviceIface;
  if (VVar4.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)
               &(this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                m_device,VVar4);
  }
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_vertexBufferAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_vertexBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  pVVar5 = (this->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
           m_allocator;
  if (pVVar5 != (VkAllocationCallbacks *)0x0) {
    (**(code **)((long)pVVar5->pUserData + 8))();
    (this->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)0x0;
  }
  obj_04.m_internal =
       *(deUint64 *)
        &(this->m_colorImageAlloc).
         super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.field_0x8;
  if (obj_04.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&this->m_colorAttachment,obj_04);
  }
  (this->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)0x0;
  (this->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  *(undefined8 *)
   &(this->m_colorImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
    m_data.field_0x8 = 0;
  (this->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal
       = 0;
  obj_05.m_internal =
       (deUint64)
       (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
       m_deviceIface;
  if (obj_05.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)
               &(this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                m_device,obj_05);
  }
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_colorImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data.ptr = (Allocation *)0x0;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  if (*(long **)&this->m_topology != (long *)0x0) {
    (**(code **)(**(long **)&this->m_topology + 8))();
    *(undefined8 *)&this->m_topology = 0;
  }
  obj_06.m_internal =
       (deUint64)
       (this->m_vertices).
       super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
       ._M_impl.super__Vector_impl_data._M_start;
  if (obj_06.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)
               &(this->m_vertices).
                super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
                ._M_impl.super__Vector_impl_data._M_finish,obj_06);
  }
  (this->m_vertices).
  super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_vertexBufferSize = 0;
  (this->m_vertices).
  super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vertices).
  super__Vector_base<vkt::FragmentOperations::(anonymous_namespace)::VertexData,_std::allocator<vkt::FragmentOperations::(anonymous_namespace)::VertexData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

ScissorRenderer (Context&					context,
					 const IVec2&				renderSize,
					 const int					numViewports,
					 const std::vector<IVec4>&	scissors,
					 const VkFormat				colorFormat,
					 const Vec4&				clearColor,
					 const std::vector<Vec4>&	vertices)
		: m_renderSize				(renderSize)
		, m_colorFormat				(colorFormat)
		, m_colorSubresourceRange	(makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u))
		, m_clearColor				(clearColor)
		, m_numViewports			(numViewports)
		, m_vertexBufferSize		(sizeInBytes(vertices))
	{
		const DeviceInterface&		vk					= context.getDeviceInterface();
		const VkDevice				device				= context.getDevice();
		const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();
		Allocator&					allocator			= context.getDefaultAllocator();

		m_colorImage		= makeImage				(vk, device, makeImageCreateInfo(m_colorFormat, m_renderSize, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT));
		m_colorImageAlloc	= bindImage				(vk, device, allocator, *m_colorImage, MemoryRequirement::Any);
		m_colorAttachment	= makeImageView			(vk, device, *m_colorImage, VK_IMAGE_VIEW_TYPE_2D, m_colorFormat, m_colorSubresourceRange);

		m_vertexBuffer		= makeBuffer			(vk, device, makeBufferCreateInfo(m_vertexBufferSize, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
		m_vertexBufferAlloc	= bindBuffer			(vk, device, allocator, *m_vertexBuffer, MemoryRequirement::HostVisible);

		{
			deMemcpy(m_vertexBufferAlloc->getHostPtr(), &vertices[0], static_cast<std::size_t>(m_vertexBufferSize));
			flushMappedMemoryRange(vk, device, m_vertexBufferAlloc->getMemory(), m_vertexBufferAlloc->getOffset(), m_vertexBufferSize);
		}

		m_vertexModule		= createShaderModule	(vk, device, context.getBinaryCollection().get("vert"), 0u);
		m_geometryModule	= createShaderModule	(vk, device, context.getBinaryCollection().get("geom"), 0u);
		m_fragmentModule	= createShaderModule	(vk, device, context.getBinaryCollection().get("frag"), 0u);
		m_renderPass		= makeRenderPass		(vk, device, m_colorFormat);
		m_framebuffer		= makeFramebuffer		(vk, device, *m_renderPass, 1u, &m_colorAttachment.get(),
													 static_cast<deUint32>(m_renderSize.x()),  static_cast<deUint32>(m_renderSize.y()));
		m_pipelineLayout	= makePipelineLayout	(vk, device);
		m_pipeline			= makeGraphicsPipeline	(vk, device, *m_pipelineLayout, *m_renderPass, *m_vertexModule, *m_geometryModule, *m_fragmentModule,
													 m_renderSize, m_numViewports, scissors);
		m_cmdPool			= createCommandPool		(vk, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex);
		m_cmdBuffer			= allocateCommandBuffer	(vk, device, *m_cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);
	}